

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

Float __thiscall pbrt::LightBounds::Importance(LightBounds *this,Point3f p,Normal3f n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Float radius;
  float local_8c;
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Tuple3<pbrt::Point3,_float> local_28;
  
  fVar23 = n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar21 = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._8_56_ = p._8_56_;
  auVar20._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar1 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
  fVar2 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  local_88 = n.super_Tuple3<pbrt::Normal3,_float>.x;
  fStack_84 = n.super_Tuple3<pbrt::Normal3,_float>.y;
  fVar3 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  local_58 = auVar20._0_16_;
  fVar4 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  fVar5 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  fVar6 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
  local_68 = vmovshdup_avx(local_58);
  fVar7 = local_68._0_4_ - (fVar3 + fVar4) * 0.5;
  fVar15 = p.super_Tuple3<pbrt::Point3,_float>.x - (fVar2 + fVar1) * 0.5;
  fVar8 = fVar21 - (fVar5 + fVar6) * 0.5;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)fVar15),
                            ZEXT416((uint)fVar15));
  auVar25 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar26 = vsqrtss_avx(auVar25,auVar25);
  fVar24 = auVar26._0_4_;
  local_78._0_4_ = fVar15 / fVar24;
  local_78._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar18._0_4_ = fVar8 / fVar24;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((fVar7 / fVar24) *
                                          (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),local_78,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar26 = vfmadd231ss_fma(auVar26,auVar18,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.z = 0.0;
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(auVar26,auVar16);
  local_38._4_12_ = auVar26._4_12_;
  local_38._0_4_ =
       (uint)(this->twoSided & 1) * auVar16._0_4_ +
       (uint)!(bool)(this->twoSided & 1) * auVar26._0_4_;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  local_48 = vxorps_avx512vl(local_38,auVar26);
  auVar26 = vfnmadd213ss_fma(local_38,local_38,ZEXT416(0x3f800000));
  auVar26 = vmaxss_avx(auVar26,ZEXT816(0) << 0x20);
  auVar26 = vsqrtss_avx(auVar26,auVar26);
  uStack_80 = in_XMM2_Qb;
  Bounds3<float>::BoundingSphere(&this->b,(Point3<float> *)&local_28,&local_8c);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_68._0_4_ - local_28.y) *
                                          ((float)local_68._0_4_ - local_28.y))),
                            ZEXT416((uint)((float)local_58._0_4_ - local_28.x)),
                            ZEXT416((uint)((float)local_58._0_4_ - local_28.x)));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)(fVar21 - local_28.z)),
                            ZEXT416((uint)(fVar21 - local_28.z)));
  if (local_8c * local_8c <= auVar16._0_4_) {
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)((local_28.y - (float)local_68._0_4_) *
                                            (local_28.y - (float)local_68._0_4_))),
                              ZEXT416((uint)(local_28.x - (float)local_58._0_4_)),
                              ZEXT416((uint)(local_28.x - (float)local_58._0_4_)));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)(local_28.z - fVar21)),
                              ZEXT416((uint)(local_28.z - fVar21)));
    auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_8c * local_8c) / auVar16._0_4_)),ZEXT416(0));
    auVar16 = vsqrtss_avx(auVar16,auVar16);
  }
  else {
    auVar16 = SUB6416(ZEXT464(0xbf800000),0);
  }
  fVar15 = this->cosTheta_o;
  auVar19 = ZEXT816(0) << 0x40;
  auVar22 = SUB6416(ZEXT464(0x3f800000),0);
  auVar11 = vfnmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),auVar22);
  auVar12 = vfnmadd213ss_fma(auVar16,auVar16,auVar22);
  auVar11 = vmaxss_avx(auVar11,auVar19);
  auVar12 = vmaxss_avx(auVar12,auVar19);
  bVar14 = fVar15 < local_38._0_4_;
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * auVar11._0_4_)),local_38,
                            ZEXT416((uint)fVar15));
  auVar17._0_4_ = (uint)bVar14 * 0x3f800000 + (uint)!bVar14 * auVar17._0_4_;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * (float)local_48._0_4_)),
                            ZEXT416((uint)auVar26._0_4_),ZEXT416((uint)fVar15));
  uVar9 = vcmpss_avx512f(auVar16,auVar17,1);
  bVar10 = (bool)((byte)uVar9 & 1);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * (float)((uint)!bVar14 * auVar26._0_4_))),
                            auVar17,auVar16);
  fVar15 = (float)((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * auVar26._0_4_);
  if (this->cosTheta_e < fVar15) {
    fVar4 = fVar4 - fVar3;
    auVar26 = ZEXT416((uint)(fVar1 - fVar2));
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar4)),auVar26,auVar26);
    auVar11._4_4_ = fStack_84;
    auVar11._0_4_ = local_88;
    auVar11._8_8_ = uStack_80;
    auVar17 = ZEXT416((uint)(fVar6 - fVar5));
    auVar26 = vfmadd231ss_fma(auVar26,auVar17,auVar17);
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    auVar26 = vmaxss_avx(ZEXT416((uint)(auVar26._0_4_ * 0.5)),ZEXT416(auVar25._0_4_));
    auVar25._0_4_ = (fVar15 * this->phi) / auVar26._0_4_;
    auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar26 = vmovshdup_avx(auVar11);
    if ((((local_88 != 0.0) || (NAN(local_88))) || (auVar26._0_4_ != 0.0)) ||
       (((NAN(auVar26._0_4_) || (fVar23 != 0.0)) || (NAN(fVar23))))) {
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 / fVar24)),auVar26,
                                ZEXT416((uint)(auVar18._0_4_ * fVar23)));
      auVar18 = vfmsub213ss_fma(ZEXT416((uint)auVar18._0_4_),ZEXT416((uint)fVar23),
                                ZEXT416((uint)(auVar18._0_4_ * fVar23)));
      auVar26 = vfmadd132ss_fma(local_78,ZEXT416((uint)(auVar26._0_4_ + auVar18._0_4_)),
                                ZEXT416((uint)local_88));
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(auVar26,auVar13);
      auVar26 = vfnmadd213ss_fma(auVar18,auVar18,auVar22);
      uVar9 = vcmpss_avx512f(auVar16,auVar18,1);
      bVar10 = (bool)((byte)uVar9 & 1);
      auVar26 = vmaxss_avx(auVar26,ZEXT816(0) << 0x20);
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * auVar12._0_4_)),auVar18,auVar16);
      auVar25 = ZEXT416((uint)((float)((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * auVar26._0_4_) *
                              auVar25._0_4_));
    }
    auVar19 = vmaxss_avx(auVar19,auVar25);
  }
  return auVar19._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Importance(Point3f p, Normal3f n) const {
        // Compute clamped squared distance to _intr_
        Point3f pc = Centroid();
        Float d2 = DistanceSquared(p, pc);
        // Don't let d2 get too small if p is inside the bounds.
        d2 = std::max(d2, Length(b.Diagonal()) / 2);

        Vector3f wi = Normalize(p - pc);

        Float cosTheta = Dot(w, wi);
        if (twoSided)
            cosTheta = std::abs(cosTheta);
#if 0
    else if (cosTheta < 0 && cosTheta_o == 1) {
        // Catch the case where the point is outside the bounds and definitely
        // not in the emitted cone even though the conservative theta_u test
        // make suggest it could be.
        // Doesn't seem to make much difference in practice.
        if ((p.x < b.pMin.x || p.x > b.pMax.x) &&
            (p.y < b.pMin.y || p.y > b.pMax.y) &&
            (p.z < b.pMin.z || p.z > b.pMax.z))
            return 0;
    }
#endif

        // FIXME? unstable when cosTheta \approx 1
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);

        // Define sine and cosine clamped subtraction lambdas
        // cos(max(0, a-b))
        auto cosSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 1;
            return cosThetaA * cosThetaB + sinThetaA * sinThetaB;
        };
        // sin(max(0, a-b))
        auto sinSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 0;
            return sinThetaA * cosThetaB - cosThetaA * sinThetaB;
        };

        // Compute $\cos \theta_\roman{u}$ for _intr_
        Float cosTheta_u = BoundSubtendedDirections(b, p).cosTheta;
        Float sinTheta_u = SafeSqrt(1 - cosTheta_u * cosTheta_u);

        // Compute $\cos \theta_\roman{p}$ for _intr_ and test against $\cos
        // \theta_\roman{e}$
        // cos(theta_p). Compute in two steps
        Float cosTheta_x = cosSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float sinTheta_x = sinSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float cosTheta_p = cosSubClamped(sinTheta_x, cosTheta_x, sinTheta_u, cosTheta_u);
        if (cosTheta_p <= cosTheta_e)
            return 0;

        Float imp = phi * cosTheta_p / d2;
        DCHECK_GE(imp, -1e-3);

        // Account for $\cos \theta_\roman{i}$ in importance at surfaces
        if (n != Normal3f(0, 0, 0)) {
            // cos(thetap_i) = cos(max(0, theta_i - theta_u))
            // cos (a-b) = cos a cos b + sin a sin b
            Float cosTheta_i = AbsDot(wi, n);
            Float sinTheta_i = SafeSqrt(1 - cosTheta_i * cosTheta_i);
            Float cosThetap_i =
                cosSubClamped(sinTheta_i, cosTheta_i, sinTheta_u, cosTheta_u);
            imp *= cosThetap_i;
        }

        return std::max<Float>(imp, 0);
    }